

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

void Js::JavascriptBigInt::SubAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  bool bVar12;
  
  iVar6 = CompareAbsolute(pbi1,pbi2);
  if (iVar6 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1e6,"(pbi1->CompareAbsolute(pbi2) == 1)",
                                "pbi1->CompareAbsolute(pbi2) == 1");
    if (!bVar5) goto LAB_00bc9180;
    *puVar7 = 0;
  }
  puVar2 = (pbi1->m_digits).ptr;
  puVar3 = (pbi2->m_digits).ptr;
  uVar9 = 0;
  for (uVar8 = 0; uVar8 < pbi2->m_length; uVar8 = uVar8 + 1) {
    uVar10 = puVar2[uVar8];
    puVar1 = puVar3 + uVar8;
    bVar5 = uVar10 < *puVar1;
    uVar10 = uVar10 - *puVar1;
    bVar12 = uVar9 <= uVar10;
    uVar11 = uVar10 - uVar9;
    uVar9 = (ulong)bVar5 + 1;
    if (bVar12) {
      uVar9 = (ulong)bVar5;
    }
    puVar2[uVar8] = uVar11;
  }
  for (; (uVar10 = pbi1->m_length, uVar8 < uVar10 && (uVar9 != 0)); uVar9 = (ulong)(uVar10 < uVar9))
  {
    puVar1 = puVar2 + uVar8;
    uVar10 = *puVar1;
    *puVar1 = *puVar1 - uVar9;
    uVar8 = uVar8 + 1;
  }
  while (uVar10 = uVar10 - 1, uVar10 != 0xffffffffffffffff) {
    if (puVar2[uVar10] != 0) {
      return;
    }
    pbi1->m_length = uVar10;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar7 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0x1ff,"(pbi1->m_length > 0)","pbi1->m_length > 0");
  if (bVar5) {
    *puVar7 = 0;
    return;
  }
LAB_00bc9180:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void JavascriptBigInt::SubAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->CompareAbsolute(pbi2) == 1);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }
        // adjust length
        while ((pbi1->m_length>0) && (pbi1->m_digits[pbi1->m_length-1] == 0))
        {
            pbi1->m_length--;
        }
        Assert(pbi1->m_length > 0);
    }